

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t read_var(archive_read *a,uint64_t *pvalue,uint64_t *pvalue_len)

{
  wchar_t wVar1;
  uint64_t uVar2;
  byte bVar3;
  uint64_t how_many;
  uint8_t *p;
  
  wVar1 = read_ahead(a,8,&p);
  if (wVar1 == L'\0') {
LAB_0053150e:
    wVar1 = L'\0';
  }
  else {
    uVar2 = 0;
    bVar3 = 0;
    for (how_many = 1; how_many != 9; how_many = how_many + 1) {
      uVar2 = uVar2 + ((ulong)(p[how_many - 1] & 0x7f) << (bVar3 & 0x3f));
      if (-1 < (char)p[how_many - 1]) {
        if (pvalue != (uint64_t *)0x0) {
          *pvalue = uVar2;
        }
        if (pvalue_len == (uint64_t *)0x0) goto LAB_00531502;
        *pvalue_len = how_many;
        goto LAB_00531512;
      }
      bVar3 = bVar3 + 7;
    }
    if (pvalue != (uint64_t *)0x0) {
      *pvalue = uVar2;
    }
    if (pvalue_len == (uint64_t *)0x0) {
      how_many = 9;
LAB_00531502:
      wVar1 = consume(a,how_many);
      if (wVar1 != L'\0') goto LAB_0053150e;
    }
    else {
      *pvalue_len = 9;
    }
LAB_00531512:
    wVar1 = L'\x01';
  }
  return wVar1;
}

Assistant:

static int read_var(struct archive_read* a, uint64_t* pvalue,
    uint64_t* pvalue_len)
{
	uint64_t result = 0;
	size_t shift, i;
	const uint8_t* p;
	uint8_t b;

	/* We will read maximum of 8 bytes. We don't have to handle the
	 * situation to read the RAR5 variable-sized value stored at the end of
	 * the file, because such situation will never happen. */
	if(!read_ahead(a, 8, &p))
		return 0;

	for(shift = 0, i = 0; i < 8; i++, shift += 7) {
		b = p[i];

		/* Strip the MSB from the input byte and add the resulting
		 * number to the `result`. */
		result += (b & (uint64_t)0x7F) << shift;

		/* MSB set to 1 means we need to continue decoding process.
		 * MSB set to 0 means we're done.
		 *
		 * This conditional checks for the second case. */
		if((b & 0x80) == 0) {
			if(pvalue) {
				*pvalue = result;
			}

			/* If the caller has passed the `pvalue_len` pointer,
			 * store the number of consumed bytes in it and do NOT
			 * consume those bytes, since the caller has all the
			 * information it needs to perform */
			if(pvalue_len) {
				*pvalue_len = 1 + i;
			} else {
				/* If the caller did not provide the
				 * `pvalue_len` pointer, it will not have the
				 * possibility to advance the file pointer,
				 * because it will not know how many bytes it
				 * needs to consume. This is why we handle
				 * such situation here automatically. */
				if(ARCHIVE_OK != consume(a, 1 + i)) {
					return 0;
				}
			}

			/* End of decoding process, return success. */
			return 1;
		}
	}

	/* The decoded value takes the maximum number of 8 bytes.
	 * It's a maximum number of bytes, so end decoding process here
	 * even if the first bit of last byte is 1. */
	if(pvalue) {
		*pvalue = result;
	}

	if(pvalue_len) {
		*pvalue_len = 9;
	} else {
		if(ARCHIVE_OK != consume(a, 9)) {
			return 0;
		}
	}

	return 1;
}